

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any.h
# Opt level: O2

vector<bool,_std::allocator<bool>_> *
cppnet::any_cast<std::vector<bool,std::allocator<bool>>>(Any *operand)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  vector<bool,_std::allocator<bool>_> *pvVar3;
  type_info *this;
  
  if (operand != (Any *)0x0) {
    if (operand->_content == (CPlaceHolder *)0x0) {
      this = (type_info *)&void::typeinfo;
    }
    else {
      iVar2 = (*operand->_content->_vptr_CPlaceHolder[2])();
      this = (type_info *)CONCAT44(extraout_var,iVar2);
    }
    bVar1 = std::type_info::operator==
                      (this,(type_info *)&std::vector<bool,std::allocator<bool>>::typeinfo);
    if (bVar1) {
      pvVar3 = (vector<bool,_std::allocator<bool>_> *)(operand->_content + 1);
    }
    else {
      pvVar3 = (vector<bool,_std::allocator<bool>_> *)0x0;
    }
    return pvVar3;
  }
  return (vector<bool,_std::allocator<bool>_> *)0x0;
}

Assistant:

ValueType* any_cast(Any * operand)  {
    if (operand && operand->Type() == typeid(ValueType)) {
        return &static_cast<Any::CHolder<ValueType> *>(operand->_content)->_held;
    }
    return nullptr;
}